

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

char * __thiscall
ctemplate_htmlparser::HtmlparserCppTest::IdToName
          (HtmlparserCppTest *this,IdNameMap *list,int enum_id)

{
  HtmlParser *source;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  IdNameMap *pIVar3;
  bool bVar4;
  int iVar5;
  HtmlparserCppTest *pHVar6;
  HtmlparserCppTest *extraout_RAX;
  undefined8 extraout_RAX_00;
  long lVar7;
  HtmlparserCppTest *pHVar8;
  char *pcVar9;
  HtmlparserCppTest *pHVar10;
  HtmlparserCppTest *pHVar11;
  HtmlparserCppTest *extraout_RAX_01;
  HtmlparserCppTest *pHVar12;
  HtmlparserCppTest *extraout_RAX_02;
  undefined7 extraout_var;
  undefined8 uVar13;
  undefined7 extraout_var_00;
  HtmlparserCppTest *extraout_RAX_03;
  char *extraout_RAX_04;
  HtmlparserCppTest *pHVar14;
  char *extraout_RAX_05;
  char *extraout_RAX_06;
  int *piVar15;
  HtmlParser *this_00;
  const_iterator cVar16;
  mapped_type *ppHVar17;
  char *extraout_RAX_07;
  undefined8 extraout_RAX_08;
  char *extraout_RDX;
  undefined7 uVar18;
  ulong uVar19;
  htmlparser_ctx *phVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  htmlparser_ctx_s *phVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  pointer this_01;
  _Base_ptr unaff_R12;
  HtmlparserCppTest *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar26;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_268;
  HtmlparserCppTest *pHStack_250;
  _Base_ptr p_Stack_248;
  undefined1 auStack_208 [16];
  _Base_ptr p_Stack_1f8;
  HtmlparserCppTest *pHStack_1f0;
  _Base_ptr p_Stack_1e8;
  undefined1 auStack_1e0 [16];
  _Base_ptr p_Stack_1d0;
  HtmlparserCppTest *pHStack_1c8;
  _Base_ptr p_Stack_1c0;
  char *pcStack_1b8;
  HtmlParser HStack_1b0;
  allocator aStack_171;
  HtmlparserCppTest *pHStack_170;
  size_t sStack_168;
  HtmlparserCppTest HStack_160;
  HtmlparserCppTest *pHStack_120;
  ulong uStack_118;
  HtmlparserCppTest *pHStack_108;
  allocator aStack_f1;
  HtmlparserCppTest *pHStack_f0;
  size_t sStack_e8;
  undefined1 auStack_e0 [40];
  HtmlparserCppTest *pHStack_b8;
  HtmlParser HStack_b0;
  HtmlparserCppTest HStack_a8;
  undefined8 uStack_70;
  IdNameMap *pIStack_68;
  HtmlparserCppTest *pHStack_60;
  allocator aStack_51;
  HtmlparserCppTest *pHStack_50;
  char *pcStack_48;
  
  if (list != (IdNameMap *)0x0) {
    pcVar9 = list->name;
    if (pcVar9 != (char *)0x0) {
      if (list->id != enum_id) {
        list = (IdNameMap *)&list[1].name;
        do {
          pcVar9 = *(char **)list;
          if (pcVar9 == (char *)0x0) goto LAB_00106eeb;
          pIVar3 = list + -1;
          list = list + 1;
        } while (*(int *)&pIVar3->name != enum_id);
      }
      return pcVar9;
    }
LAB_00106eeb:
    IdToName();
  }
  IdToName();
  if (list != (IdNameMap *)0x0) {
    pcVar9 = list->name;
    while (pcVar9 != (char *)0x0) {
      iVar5 = std::__cxx11::string::compare(extraout_RDX);
      if (iVar5 == 0) goto LAB_00106f2c;
      pIVar3 = list + 1;
      list = list + 1;
      pcVar9 = pIVar3->name;
    }
    NameToId();
LAB_00106f2c:
    return (char *)(ulong)(uint)list->id;
  }
  NameToId();
  pHVar12 = (HtmlparserCppTest *)(this->parser_).parser_;
  pHStack_60 = (HtmlparserCppTest *)0x106f4f;
  iVar5 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar12);
  puVar21 = kStateMap;
  pHStack_60 = (HtmlparserCppTest *)0x106f5d;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kStateMap,iVar5);
  if (list->name == (char *)0x0) {
    pHStack_60 = (HtmlparserCppTest *)0x106fcd;
    ValidateState();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_50;
    pHStack_60 = (HtmlparserCppTest *)0x106f79;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar6,&aStack_51);
    pcVar9 = list->name;
    puVar21 = (undefined1 *)pHVar6;
    if (pcVar9 == pcStack_48) {
      uVar18 = (undefined7)((ulong)list >> 8);
      if (pcVar9 == (char *)0x0) {
        list = (IdNameMap *)CONCAT71(uVar18,1);
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)list;
        pHStack_60 = (HtmlparserCppTest *)0x106f98;
        puVar21 = (undefined1 *)pHStack_50;
        iVar5 = bcmp(pHVar12,pHStack_50,(size_t)pcVar9);
        list = (IdNameMap *)CONCAT71(uVar18,iVar5 == 0);
      }
    }
    else {
      list = (IdNameMap *)0x0;
    }
    pHVar6 = (HtmlparserCppTest *)&stack0xffffffffffffffc0;
    if (pHStack_50 != pHVar6) {
      pHStack_60 = (HtmlparserCppTest *)0x106fbc;
      pHVar12 = pHStack_50;
      operator_delete(pHStack_50);
      pHVar6 = extraout_RAX;
    }
    unaff_R14 = pHStack_50;
    if ((char)list != '\0') {
      return (char *)pHVar6;
    }
  }
  pHStack_60 = (HtmlparserCppTest *)ValidateTag;
  ValidateState();
  pHStack_60 = unaff_R14;
  pIStack_68 = list;
  uStack_70 = extraout_RAX_00;
  pHVar6 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106fe5;
  pHVar8 = (HtmlparserCppTest *)puVar21;
  lVar7 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar6);
  if (lVar7 == 0) {
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x10700f;
    ValidateTag();
  }
  else {
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106ff3;
    pHVar8 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar12->parser_).parser_);
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106ffe;
    pHVar6 = (HtmlparserCppTest *)puVar21;
    pcVar9 = (char *)std::__cxx11::string::compare(puVar21);
    if ((int)pcVar9 == 0) {
      return pcVar9;
    }
  }
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  pHVar14 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107027;
  pHVar10 = pHVar8;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar21;
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)pHVar12;
  lVar7 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)pHVar14);
  if (lVar7 == 0) {
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107051;
    ValidateAttribute();
  }
  else {
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107035;
    pHVar10 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar6->parser_).parser_);
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107040;
    pHVar14 = pHVar8;
    pcVar9 = (char *)std::__cxx11::string::compare((char *)pHVar8);
    if ((int)pcVar9 == 0) {
      return pcVar9;
    }
  }
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar12 = (HtmlparserCppTest *)(pHVar14->parser_).parser_;
  auStack_e0._24_8_ = (_Base_ptr)0x10706c;
  pHVar11 = pHVar10;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar8;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar6;
  lVar7 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar12);
  if (lVar7 != 0) {
    auStack_e0._24_8_ = (_Base_ptr)0x10707a;
    pHVar11 = (HtmlparserCppTest *)
              ctemplate_htmlparser::htmlparser_value((pHVar14->parser_).parser_);
    auStack_e0._24_8_ = (_Base_ptr)0x10708f;
    pHVar12 = (HtmlparserCppTest *)&pHStack_b8;
    std::__cxx11::string::string
              ((string *)&pHStack_b8,(char *)pHVar11,(allocator *)(auStack_e0 + 0x27));
    phVar20 = *(htmlparser_ctx **)
               &(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    pHVar14 = (HtmlparserCppTest *)&pHStack_b8;
    if (phVar20 == HStack_b0.parser_) {
      if (phVar20 == (htmlparser_ctx *)0x0) {
LAB_001070b2:
        pHVar12 = &HStack_a8;
        if (pHStack_b8 != pHVar12) {
          auStack_e0._24_8_ = (_Base_ptr)0x1070c4;
          operator_delete(pHStack_b8);
          pHVar12 = extraout_RAX_01;
        }
        return (char *)pHVar12;
      }
      pHVar12 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
      auStack_e0._24_8_ = (_Base_ptr)0x1070ae;
      pHVar11 = pHStack_b8;
      iVar5 = bcmp(pHVar12,pHStack_b8,(size_t)phVar20);
      pHVar14 = pHStack_b8;
      if (iVar5 == 0) goto LAB_001070b2;
    }
    auStack_e0._24_8_ = (_Base_ptr)0x1070d1;
    ValidateValue();
  }
  auStack_e0._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_e0._24_8_ = pHVar14;
  auStack_e0._16_8_ = pHVar10;
  pHVar12 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  iVar5 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar12);
  puVar21 = kAttributeTypeMap;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kAttributeTypeMap,iVar5);
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_f0;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar6,&aStack_f1);
    sVar2 = *(size_t *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar21 = (undefined1 *)pHVar6;
    if (sVar2 == sStack_e8) {
      uVar18 = (undefined7)((ulong)pHVar11 >> 8);
      if (sVar2 == 0) {
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar18,1);
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)&(pHVar11->contextMap)._M_t._M_impl;
        puVar21 = (undefined1 *)pHStack_f0;
        iVar5 = bcmp(pHVar12,pHStack_f0,sVar2);
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar18,iVar5 == 0);
      }
    }
    else {
      pHVar11 = (HtmlparserCppTest *)0x0;
    }
    pHVar6 = (HtmlparserCppTest *)auStack_e0;
    if (pHStack_f0 != pHVar6) {
      pHVar12 = pHStack_f0;
      operator_delete(pHStack_f0);
      pHVar6 = extraout_RAX_02;
    }
    pHVar14 = pHStack_f0;
    if ((char)pHVar11 != '\0') {
      return (char *)pHVar6;
    }
  }
  ValidateAttributeType();
  uStack_118 = 0x10717a;
  pHStack_108 = pHVar11;
  bVar4 = StringToBool((string *)puVar21);
  uVar19 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
  phVar23 = (pHVar12->parser_).parser_;
  uStack_118 = 0x107185;
  uVar13 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar23);
  bVar4 = (int)uVar13 != 0;
  if (SUB81(uVar19,0) == bVar4) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar4);
  }
  uStack_118 = 0x10719b;
  ValidateAttributeQuoted();
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x1071aa;
  pHStack_120 = pHVar12;
  uStack_118 = uVar19;
  bVar4 = StringToBool((string *)puVar21);
  phVar20 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar4) & 0xffffffff);
  p_Var24 = *(_Base_ptr *)(phVar23 + 0x30);
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x1071b5;
  uVar13 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var24);
  bVar4 = (int)uVar13 != 0;
  if (SUB81(phVar20,0) == bVar4) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar4);
  }
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x1071cb;
  ValidateInJavascript();
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071da;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar23;
  HStack_160.parser_.parser_ = phVar20;
  bVar4 = StringToBool((string *)puVar21);
  p_Var25 = p_Var24[1]._M_left;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071e5;
  uVar13 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var25);
  bVar26 = (int)uVar13 != 0;
  if (bVar4 == bVar26) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071fb;
  ValidateJavascriptQuoted();
  pHVar12 = (HtmlparserCppTest *)p_Var25[1]._M_left;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var24;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar14;
  iVar5 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar12);
  puVar22 = kJavascriptStateMap;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kJavascriptStateMap,iVar5);
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    pHVar12 = (HtmlparserCppTest *)&pHStack_170;
    std::__cxx11::string::string((string *)pHVar12,(char *)pHVar6,&aStack_171);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar22 = (undefined1 *)pHVar6;
    if (sVar2 == sStack_168) {
      if (sVar2 == 0) {
        bVar4 = true;
      }
      else {
        pHVar12 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
        puVar22 = (undefined1 *)pHStack_170;
        iVar5 = bcmp(pHVar12,pHStack_170,sVar2);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    pHVar6 = &HStack_160;
    if (pHStack_170 != pHVar6) {
      pHVar12 = pHStack_170;
      operator_delete(pHStack_170);
      pHVar6 = extraout_RAX_03;
    }
    pHVar14 = pHStack_170;
    if (bVar4) {
      return (char *)pHVar6;
    }
  }
  ValidateJavascriptState();
  bVar4 = StringToBool((string *)puVar22);
  pHVar6 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)pHVar6);
  bVar26 = (int)uVar13 != 0;
  if (bVar4 == bVar26) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  ValidateInCss();
  pHVar10 = (HtmlparserCppTest *)&pcStack_1b8;
  pHVar8 = pHVar6;
  HStack_1b0.parser_ = (htmlparser_ctx *)pHVar12;
  if (*(long *)&(((HtmlparserCppTest *)puVar22)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
LAB_00107324:
    pHVar10 = (HtmlparserCppTest *)puVar22;
    p_Stack_1c0 = (_Base_ptr)0x107329;
    ValidateLine();
  }
  else {
    p_Stack_1c0 = (_Base_ptr)0x1072dc;
    pcStack_1b8 = extraout_RAX_04;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar8 = *(HtmlparserCppTest **)&(((HtmlparserCppTest *)puVar22)->contextMap)._M_t._M_impl;
    p_Stack_1c0 = (_Base_ptr)0x1072f8;
    pHVar14 = (HtmlparserCppTest *)strtol((char *)pHVar8,&pcStack_1b8,10);
    pHVar12 = pHVar6;
    puVar22 = (undefined1 *)pHVar10;
    unaff_R12 = (_Base_ptr)&pcStack_1b8;
    if ((*pcStack_1b8 != '\0') ||
       (unaff_R12 = (_Base_ptr)&pcStack_1b8, unaff_R15->_M_color != _S_red)) goto LAB_00107324;
    pHVar8 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
    p_Stack_1c0 = (_Base_ptr)0x107313;
    pcVar9 = (char *)ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)pHVar8);
    unaff_R12 = (_Base_ptr)&pcStack_1b8;
    if ((int)pcVar9 == (int)pHVar14) {
      return pcVar9;
    }
  }
  p_Stack_1c0 = (_Base_ptr)ValidateColumn;
  ValidateLine();
  pHVar11 = (HtmlparserCppTest *)auStack_1e0;
  pHVar6 = pHVar8;
  auStack_1e0._8_8_ = pHVar12;
  p_Stack_1d0 = unaff_R12;
  pHStack_1c8 = pHVar14;
  p_Stack_1c0 = unaff_R15;
  if (*(long *)&(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
LAB_00107390:
    pHVar11 = pHVar10;
    p_Stack_1e8 = (_Base_ptr)0x107395;
    ValidateColumn();
  }
  else {
    p_Stack_1e8 = (_Base_ptr)0x107348;
    auStack_1e0._0_8_ = extraout_RAX_05;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    pHVar6 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
    p_Stack_1e8 = (_Base_ptr)0x107364;
    pHVar14 = (HtmlparserCppTest *)strtol((char *)pHVar6,(char **)auStack_1e0,10);
    pHVar12 = pHVar8;
    pHVar10 = pHVar11;
    unaff_R12 = (_Base_ptr)auStack_1e0;
    if ((*(char *)auStack_1e0._0_8_ != '\0') ||
       (unaff_R12 = (_Base_ptr)auStack_1e0, unaff_R15->_M_color != _S_red)) goto LAB_00107390;
    pHVar6 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
    p_Stack_1e8 = (_Base_ptr)0x10737f;
    pcVar9 = (char *)ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)pHVar6);
    unaff_R12 = (_Base_ptr)auStack_1e0;
    if ((int)pcVar9 == (int)pHVar14) {
      return pcVar9;
    }
  }
  p_Stack_1e8 = (_Base_ptr)ValidateValueIndex;
  ValidateColumn();
  pHVar10 = (HtmlparserCppTest *)auStack_208;
  pHVar8 = pHVar6;
  auStack_208._8_8_ = pHVar12;
  p_Stack_1f8 = unaff_R12;
  pHStack_1f0 = pHVar14;
  p_Stack_1e8 = unaff_R15;
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
    auStack_208._0_8_ = extraout_RAX_06;
    piVar15 = __errno_location();
    *piVar15 = 0;
    pHVar8 = *(HtmlparserCppTest **)&(pHVar11->contextMap)._M_t._M_impl;
    lVar7 = strtol((char *)pHVar8,(char **)auStack_208,10);
    pHVar11 = pHVar10;
    unaff_R12 = (_Base_ptr)auStack_208;
    if ((*(char *)auStack_208._0_8_ == '\0') && (unaff_R12 = (_Base_ptr)auStack_208, *piVar15 == 0))
    {
      pHVar8 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
      pcVar9 = (char *)ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)pHVar8);
      unaff_R12 = (_Base_ptr)auStack_208;
      if ((int)pcVar9 == (int)lVar7) {
        return pcVar9;
      }
      goto LAB_00107401;
    }
  }
  pHVar10 = pHVar11;
  ValidateValueIndex();
LAB_00107401:
  ValidateValueIndex();
  bVar4 = StringToBool((string *)pHVar10);
  pHVar12 = (HtmlparserCppTest *)(pHVar8->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar12);
  bVar26 = (int)uVar13 != 0;
  if (bVar4 == bVar26) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar26);
  }
  ValidateIsUrlStart();
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHStack_250 = pHVar8;
  p_Stack_248 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)pHVar10,"=",",",&vStack_268);
  if (vStack_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    source = &pHVar12->parser_;
    p_Var1 = &(pHVar12->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_268.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar5 = std::__cxx11::string::compare((char *)str_00);
      if (iVar5 == 0) {
        ValidateState(pHVar12,str);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)str_00);
        if (iVar5 == 0) {
          ValidateTag(pHVar12,str);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)str_00);
          if (iVar5 == 0) {
            ValidateAttribute(pHVar12,str);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)str_00);
            if (iVar5 == 0) {
              ValidateValue(pHVar12,str);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)str_00);
              if (iVar5 == 0) {
                ValidateAttributeType(pHVar12,str);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)str_00);
                if (iVar5 == 0) {
                  ValidateAttributeQuoted(pHVar12,str);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar5 == 0) {
                    ValidateInJavascript(pHVar12,str);
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar5 == 0) {
                      ValidateJavascriptQuoted(pHVar12,str);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar5 == 0) {
                        ValidateJavascriptState(pHVar12,str);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar5 == 0) {
                          ValidateInCss(pHVar12,str);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar5 == 0) {
                            ValidateLine(pHVar12,str);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar5 == 0) {
                              ValidateColumn(pHVar12,str);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar5 == 0) {
                                ValidateValueIndex(pHVar12,str);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar5 == 0) {
                                  ValidateIsUrlStart(pHVar12,str);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar5 == 0) {
                                    cVar16 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                    if ((_Rb_tree_header *)cVar16._M_node == p_Var1) {
                                      this_00 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_00);
                                      ppHVar17 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      *ppHVar17 = this_00;
                                    }
                                    ppHVar17 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar12->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar17,source);
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar5 == 0) {
                                      cVar16 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                      if ((_Rb_tree_header *)cVar16._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_00107851:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_268);
                                        _Unwind_Resume(extraout_RAX_08);
                                      }
                                      ppHVar17 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      HtmlParser::CopyFrom(source,*ppHVar17);
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar5 == 0) {
                                        bVar4 = StringToBool(str);
                                        if (bVar4) {
                                          ctemplate_htmlparser::htmlparser_reset(source->parser_);
                                        }
                                      }
                                      else {
                                        this_01 = str_00;
                                        iVar5 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar5 == 0) {
                                          iVar5 = NameToId((HtmlparserCppTest *)this_01,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    (source->parser_,iVar5);
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar5 != 0) goto LAB_00107851;
                                          bVar4 = StringToBool(str);
                                          if (bVar4) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      (source->parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_268.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_268);
  return extraout_RAX_07;
}

Assistant:

const char *HtmlparserCppTest::IdToName(const struct IdNameMap *list,
                                        int enum_id) {
  CHECK(list != NULL);
  while (list->name) {
    if (enum_id == list->id) {
      return list->name;
    }
    list++;
  }
  LOG(FATAL) << "Unknown id";
}